

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O0

void __thiscall
slang::ast::SequenceConcatExpr::visitExprs<hgdb::rtl::ExpressionPrinter&>
          (SequenceConcatExpr *this,ExpressionPrinter *visitor)

{
  iterator pEVar1;
  AssertionExpr *this_00;
  Element *elem;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *__range3;
  ExpressionPrinter *visitor_local;
  SequenceConcatExpr *this_local;
  
  __end3 = nonstd::span_lite::
           span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::begin
                     (&this->elements);
  pEVar1 = nonstd::span_lite::
           span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::end
                     (&this->elements);
  for (; __end3 != pEVar1; __end3 = __end3 + 1) {
    this_00 = not_null<const_slang::ast::AssertionExpr_*>::operator->(&__end3->sequence);
    AssertionExpr::visit<hgdb::rtl::ExpressionPrinter>(this_00,visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& elem : elements)
            elem.sequence->visit(visitor);
    }